

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::SPxShellsort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::IdxCompare>
               (Nonzero<double> *keys,int end,IdxCompare *compare,int start)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  int in_ECX;
  undefined8 *puVar4;
  int in_ESI;
  long in_RDI;
  bool bVar5;
  Nonzero<double> tempkey;
  int j;
  int i;
  int first;
  int h;
  int k;
  uint7 in_stack_ffffffffffffffb8;
  Element *e1;
  IdxCompare *this;
  int local_30;
  int local_2c;
  int local_20;
  
  for (local_20 = 2; -1 < local_20; local_20 = local_20 + -1) {
    iVar1 = SPxShellsort<soplex::Nonzero<double>,_soplex::SPxMainSM<double>::IdxCompare>::incs
            [local_20];
    for (local_2c = iVar1 + in_ECX; local_2c <= in_ESI; local_2c = local_2c + 1) {
      puVar3 = (undefined8 *)(in_RDI + (long)local_2c * 0x10);
      e1 = (Element *)*puVar3;
      this = (IdxCompare *)puVar3[1];
      local_30 = local_2c;
      while( true ) {
        bVar5 = false;
        if (iVar1 + in_ECX <= local_30) {
          iVar2 = SPxMainSM<double>::IdxCompare::operator()
                            (this,e1,(Element *)(ulong)in_stack_ffffffffffffffb8);
          bVar5 = iVar2 < 0;
        }
        if (!bVar5) break;
        puVar4 = (undefined8 *)(in_RDI + (long)(local_30 - iVar1) * 0x10);
        puVar3 = (undefined8 *)(in_RDI + (long)local_30 * 0x10);
        *puVar3 = *puVar4;
        *(undefined4 *)(puVar3 + 1) = *(undefined4 *)(puVar4 + 1);
        local_30 = local_30 - iVar1;
      }
      puVar3 = (undefined8 *)(in_RDI + (long)local_30 * 0x10);
      *puVar3 = e1;
      *(int *)(puVar3 + 1) = (int)this;
    }
  }
  return;
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}